

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

htab_hash_t mem_expr_hash(mem_expr_t e,void *arg)

{
  byte bVar1;
  MIR_insn_t pMVar2;
  long lVar3;
  uint64_t uVar4;
  long lVar5;
  uint64_t uStack_20;
  
  pMVar2 = e->insn;
  if ((*(uint *)&pMVar2->field_0x18 & 0xfffffffc) != 0) {
    __assert_fail("move_code_p (st->code)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0xe7e,"htab_hash_t mem_expr_hash(mem_expr_t, void *)");
  }
  lVar5 = 0x50;
  if (pMVar2->ops[0].field_0x8 == '\v') {
    lVar5 = 0x20;
  }
  if (*(char *)((long)pMVar2->ops + lVar5 + -0x18) == '\v') {
    lVar3 = *(long *)((long)pMVar2->ops + lVar5 + -0x20);
    if (lVar3 == 0) {
      uVar4 = 0x23;
    }
    else {
      lVar3 = *(long *)(lVar3 + 8);
      uVar4 = mir_hash_step(0x23,(ulong)*(byte *)(lVar3 + 8));
      uVar4 = mir_hash_step(uVar4 & 0xffffffff,*(uint64_t *)(lVar3 + 0x18));
      uVar4 = uVar4 & 0xffffffff;
    }
    bVar1 = *(byte *)((long)pMVar2->ops + lVar5 + -0x10);
    uStack_20 = (uint64_t)bVar1;
    if (bVar1 == 7) {
      uStack_20 = 6;
    }
    else if (bVar1 == 0xb) {
      uStack_20 = 4;
    }
    uVar4 = mir_hash_step(uVar4,uStack_20);
    uVar4 = mir_hash_step(uVar4 & 0xffffffff,(ulong)*(uint *)((long)pMVar2->ops + lVar5 + -0xc));
    uVar4 = mir_hash_step(uVar4 & 0xffffffff,(ulong)*(uint *)((long)pMVar2->ops + lVar5 + -8));
    uVar4 = mir_hash_finish(uVar4 & 0xffffffff);
    return (htab_hash_t)uVar4;
  }
  __assert_fail("op_ref->mode == MIR_OP_VAR_MEM",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0xe80,"htab_hash_t mem_expr_hash(mem_expr_t, void *)");
}

Assistant:

static htab_hash_t mem_expr_hash (mem_expr_t e, void *arg MIR_UNUSED) {
  MIR_insn_t st = e->insn;
  MIR_op_t *op_ref;
  ssa_edge_t ssa_edge;
  htab_hash_t h = (htab_hash_t) mir_hash_init (0x23);

  gen_assert (move_code_p (st->code));
  op_ref = st->ops[0].mode == MIR_OP_VAR_MEM ? &st->ops[0] : &st->ops[1];
  gen_assert (op_ref->mode == MIR_OP_VAR_MEM);
  if ((ssa_edge = op_ref->data) != NULL) {
    h = (htab_hash_t) mir_hash_step (h, (uint64_t) ssa_edge->def->gvn_val_const_p);
    h = (htab_hash_t) mir_hash_step (h, (uint64_t) ssa_edge->def->gvn_val);
  }
  h = (htab_hash_t) mir_hash_step (h, (uint64_t) canonic_mem_type (op_ref->u.var_mem.type));
  h = (htab_hash_t) mir_hash_step (h, (uint64_t) op_ref->u.var_mem.alias);
  h = (htab_hash_t) mir_hash_step (h, (uint64_t) op_ref->u.var_mem.nonalias);
  return (htab_hash_t) mir_hash_finish (h);
}